

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTWeather.cpp
# Opt level: O0

void __thiscall LTWeather::Log(LTWeather *this,string *msg)

{
  logLevelTy lVar1;
  ostream *poVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long in_RDI;
  float *f_12;
  const_iterator __end1_12;
  const_iterator __begin1_12;
  array<float,_3UL> *__range1_12;
  float *f_11;
  const_iterator __end1_11;
  const_iterator __begin1_11;
  array<float,_3UL> *__range1_11;
  float *f_10;
  const_iterator __end1_10;
  const_iterator __begin1_10;
  array<float,_3UL> *__range1_10;
  float *f_9;
  const_iterator __end1_9;
  const_iterator __begin1_9;
  array<float,_3UL> *__range1_9;
  float *f_8;
  const_iterator __end1_8;
  const_iterator __begin1_8;
  array<float,_13UL> *__range1_8;
  float *f_7;
  const_iterator __end1_7;
  const_iterator __begin1_7;
  array<float,_13UL> *__range1_7;
  float *f_6;
  const_iterator __end1_6;
  const_iterator __begin1_6;
  array<float,_13UL> *__range1_6;
  float *f_5;
  const_iterator __end1_5;
  const_iterator __begin1_5;
  array<float,_13UL> *__range1_5;
  float *f_4;
  const_iterator __end1_4;
  const_iterator __begin1_4;
  array<float,_13UL> *__range1_4;
  float *f_3;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  array<float,_13UL> *__range1_3;
  float *f_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  array<float,_13UL> *__range1_2;
  float *f_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  array<float,_13UL> *__range1_1;
  float *f;
  const_iterator __end1;
  const_iterator __begin1;
  array<float,_13UL> *__range1;
  ostringstream lOut;
  char *local_670;
  positionTy *in_stack_fffffffffffffa28;
  string local_3e0 [32];
  int local_3c0;
  int local_3bc;
  float *local_3b8;
  float *local_3b0;
  float *local_3a8;
  long local_3a0;
  int local_394;
  float *local_390;
  float *local_388;
  float *local_380;
  long local_378;
  int local_36c;
  float *local_368;
  float *local_360;
  float *local_358;
  long local_350;
  int local_344;
  float *local_340;
  float *local_338;
  float *local_330;
  long local_328;
  int local_31c;
  float *local_318;
  float *local_310;
  float *local_308;
  long local_300;
  int local_2f4;
  float *local_2f0;
  float *local_2e8;
  float *local_2e0;
  long local_2d8;
  int local_2cc;
  float *local_2c8;
  float *local_2c0;
  float *local_2b8;
  long local_2b0;
  int local_2a4;
  float *local_2a0;
  float *local_298;
  float *local_290;
  long local_288;
  int local_27c;
  float *local_278;
  float *local_270;
  float *local_268;
  long local_260;
  int local_254;
  float *local_250;
  float *local_248;
  float *local_240;
  long local_238;
  int local_22c;
  float *local_228;
  float *local_220;
  float *local_218;
  long local_210;
  int local_204;
  float *local_200;
  float *local_1f8;
  float *local_1f0;
  long local_1e8;
  int local_1dc;
  float *local_1d8;
  float *local_1d0;
  float *local_1c8;
  long local_1c0;
  string local_1b8 [32];
  int local_198;
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar2 = (ostream *)std::ostream::operator<<(local_188,std::fixed);
  local_198 = (int)std::setprecision(1);
  std::operator<<(poVar2,(_Setprecision)local_198);
  poVar2 = std::operator<<((ostream *)local_188,"pos:         ");
  positionTy::operator_cast_to_string(in_stack_fffffffffffffa28);
  poVar2 = std::operator<<(poVar2,local_1b8);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string(local_1b8);
  poVar2 = std::operator<<((ostream *)local_188,"vis:         ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(in_RDI + 0x48));
  std::operator<<(poVar2,"sm, ");
  poVar2 = std::operator<<((ostream *)local_188,"sea_pressure: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(in_RDI + 0x4c));
  std::operator<<(poVar2,"pas, ");
  poVar2 = std::operator<<((ostream *)local_188,"sea_temp: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(in_RDI + 0x50));
  std::operator<<(poVar2,"C, ");
  poVar2 = std::operator<<((ostream *)local_188,"qnh_base_elev: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(in_RDI + 0x54));
  std::operator<<(poVar2,"?, ");
  poVar2 = std::operator<<((ostream *)local_188,"qnh_pas:");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(in_RDI + 0x58));
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<((ostream *)local_188,"rain: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(in_RDI + 0x5c) * 100.0);
  std::operator<<(poVar2,"%,\n");
  std::operator<<((ostream *)local_188,"wind_alt:    ");
  local_1c0 = in_RDI + 0x94;
  local_1c8 = std::array<float,_13UL>::begin((array<float,_13UL> *)0x234e9d);
  local_1d0 = std::array<float,_13UL>::end((array<float,_13UL> *)0x234eb2);
  for (; local_1c8 != local_1d0; local_1c8 = local_1c8 + 1) {
    local_1d8 = local_1c8;
    local_1dc = (int)std::setw(8);
    poVar2 = std::operator<<((ostream *)local_188,(_Setw)local_1dc);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_1d8);
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)local_188,"m\n");
  std::operator<<((ostream *)local_188,"wind_speed:  ");
  local_1e8 = in_RDI + 200;
  local_1f0 = std::array<float,_13UL>::begin((array<float,_13UL> *)0x235001);
  local_1f8 = std::array<float,_13UL>::end((array<float,_13UL> *)0x235016);
  for (; local_1f0 != local_1f8; local_1f0 = local_1f0 + 1) {
    local_200 = local_1f0;
    local_204 = (int)std::setw(8);
    poVar2 = std::operator<<((ostream *)local_188,(_Setw)local_204);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_200);
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)local_188,"kts\n");
  std::operator<<((ostream *)local_188,"wind_dir:    ");
  local_210 = in_RDI + 0xfc;
  local_218 = std::array<float,_13UL>::begin((array<float,_13UL> *)0x235126);
  local_220 = std::array<float,_13UL>::end((array<float,_13UL> *)0x23513b);
  for (; local_218 != local_220; local_218 = local_218 + 1) {
    local_228 = local_218;
    local_22c = (int)std::setw(8);
    poVar2 = std::operator<<((ostream *)local_188,(_Setw)local_22c);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_228);
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)local_188,"deg\n");
  std::operator<<((ostream *)local_188,"shear_speed: ");
  local_238 = in_RDI + 0x130;
  local_240 = std::array<float,_13UL>::begin((array<float,_13UL> *)0x23524b);
  local_248 = std::array<float,_13UL>::end((array<float,_13UL> *)0x235260);
  for (; local_240 != local_248; local_240 = local_240 + 1) {
    local_250 = local_240;
    local_254 = (int)std::setw(8);
    poVar2 = std::operator<<((ostream *)local_188,(_Setw)local_254);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_250);
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)local_188,"kts\n");
  std::operator<<((ostream *)local_188,"shear_dir:   ");
  local_260 = in_RDI + 0x164;
  local_268 = std::array<float,_13UL>::begin((array<float,_13UL> *)0x235370);
  local_270 = std::array<float,_13UL>::end((array<float,_13UL> *)0x235385);
  for (; local_268 != local_270; local_268 = local_268 + 1) {
    local_278 = local_268;
    local_27c = (int)std::setw(8);
    poVar2 = std::operator<<((ostream *)local_188,(_Setw)local_27c);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_278);
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)local_188,"deg\n");
  std::operator<<((ostream *)local_188,"turbulence:  ");
  local_288 = in_RDI + 0x198;
  local_290 = std::array<float,_13UL>::begin((array<float,_13UL> *)0x235495);
  local_298 = std::array<float,_13UL>::end((array<float,_13UL> *)0x2354aa);
  for (; local_290 != local_298; local_290 = local_290 + 1) {
    local_2a0 = local_290;
    local_2a4 = (int)std::setw(8);
    poVar2 = std::operator<<((ostream *)local_188,(_Setw)local_2a4);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_2a0);
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)local_188,"\n");
  std::operator<<((ostream *)local_188,"dewpoint:    ");
  local_2b0 = in_RDI + 0x1cc;
  local_2b8 = std::array<float,_13UL>::begin((array<float,_13UL> *)0x2355ba);
  local_2c0 = std::array<float,_13UL>::end((array<float,_13UL> *)0x2355cf);
  for (; local_2b8 != local_2c0; local_2b8 = local_2b8 + 1) {
    local_2c8 = local_2b8;
    local_2cc = (int)std::setw(8);
    poVar2 = std::operator<<((ostream *)local_188,(_Setw)local_2cc);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_2c8);
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)local_188,"C\n");
  std::operator<<((ostream *)local_188,"temp_alt:    ");
  local_2d8 = in_RDI + 0x200;
  local_2e0 = std::array<float,_13UL>::begin((array<float,_13UL> *)0x2356df);
  local_2e8 = std::array<float,_13UL>::end((array<float,_13UL> *)0x2356f4);
  for (; local_2e0 != local_2e8; local_2e0 = local_2e0 + 1) {
    local_2f0 = local_2e0;
    local_2f4 = (int)std::setw(8);
    poVar2 = std::operator<<((ostream *)local_188,(_Setw)local_2f4);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_2f0);
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)local_188,"m\n");
  std::operator<<((ostream *)local_188,"temp:        ");
  local_300 = in_RDI + 0x234;
  local_308 = std::array<float,_13UL>::begin((array<float,_13UL> *)0x235804);
  local_310 = std::array<float,_13UL>::end((array<float,_13UL> *)0x235819);
  for (; local_308 != local_310; local_308 = local_308 + 1) {
    local_318 = local_308;
    local_31c = (int)std::setw(8);
    poVar2 = std::operator<<((ostream *)local_188,(_Setw)local_31c);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_318);
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)local_188,"C\n");
  std::operator<<((ostream *)local_188,"cloud_type:  ");
  local_328 = in_RDI + 0x268;
  local_330 = std::array<float,_3UL>::begin((array<float,_3UL> *)0x235929);
  local_338 = std::array<float,_3UL>::end((array<float,_3UL> *)0x23593e);
  for (; local_330 != local_338; local_330 = local_330 + 1) {
    local_340 = local_330;
    local_344 = (int)std::setw(8);
    poVar2 = std::operator<<((ostream *)local_188,(_Setw)local_344);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_340);
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)local_188,"0=Ci, 1=St, 2=Cu, 3=Cb\n");
  std::operator<<((ostream *)local_188,"cloud_cover: ");
  local_350 = in_RDI + 0x274;
  local_358 = std::array<float,_3UL>::begin((array<float,_3UL> *)0x235a4e);
  local_360 = std::array<float,_3UL>::end((array<float,_3UL> *)0x235a63);
  for (; local_358 != local_360; local_358 = local_358 + 1) {
    local_368 = local_358;
    local_36c = (int)std::setw(8);
    poVar2 = std::operator<<((ostream *)local_188,(_Setw)local_36c);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_368 * 100.0);
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)local_188,"%\n");
  std::operator<<((ostream *)local_188,"cloud_base:  ");
  local_378 = in_RDI + 0x280;
  local_380 = std::array<float,_3UL>::begin((array<float,_3UL> *)0x235b7f);
  local_388 = std::array<float,_3UL>::end((array<float,_3UL> *)0x235b94);
  for (; local_380 != local_388; local_380 = local_380 + 1) {
    local_390 = local_380;
    local_394 = (int)std::setw(8);
    poVar2 = std::operator<<((ostream *)local_188,(_Setw)local_394);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_390);
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)local_188,"m\n");
  std::operator<<((ostream *)local_188,"cloud_tops:  ");
  local_3a0 = in_RDI + 0x28c;
  local_3a8 = std::array<float,_3UL>::begin((array<float,_3UL> *)0x235ca4);
  local_3b0 = std::array<float,_3UL>::end((array<float,_3UL> *)0x235cb9);
  for (; local_3a8 != local_3b0; local_3a8 = local_3a8 + 1) {
    local_3b8 = local_3a8;
    local_3bc = (int)std::setw(8);
    poVar2 = std::operator<<((ostream *)local_188,(_Setw)local_3bc);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_3b8);
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)local_188,"m\n");
  local_3c0 = (int)std::setw(0);
  std::operator<<((ostream *)local_188,(_Setw)local_3c0);
  poVar2 = std::operator<<((ostream *)local_188,"tropo_temp:  ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(in_RDI + 0x298));
  std::operator<<(poVar2,"c, ");
  poVar2 = std::operator<<((ostream *)local_188,"tropo_alt: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(in_RDI + 0x29c));
  std::operator<<(poVar2,"m, ");
  poVar2 = std::operator<<((ostream *)local_188,"thermal_rate: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(in_RDI + 0x2a0));
  std::operator<<(poVar2,"m/s, ");
  poVar2 = std::operator<<((ostream *)local_188,"wave_amp: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(in_RDI + 0x2a4));
  std::operator<<(poVar2,"m, ");
  poVar2 = std::operator<<((ostream *)local_188,"wave_dir: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(in_RDI + 0x2a8));
  std::operator<<(poVar2,"deg, ");
  poVar2 = std::operator<<((ostream *)local_188,"rwy_fric: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x2ac));
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<((ostream *)local_188,"variability: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(in_RDI + 0x2b0) * 100.0);
  std::operator<<(poVar2,"%\n");
  if (((-1 < *(int *)(in_RDI + 0x2b8)) || (-1 < *(int *)(in_RDI + 700))) ||
     (-1 < *(int *)(in_RDI + 0x2c0))) {
    poVar2 = std::operator<<((ostream *)local_188,"immediately: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(*(byte *)(in_RDI + 0x2b4) & 1));
    std::operator<<(poVar2,", ");
    poVar2 = std::operator<<((ostream *)local_188,"change mode: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x2b8));
    std::operator<<(poVar2,", ");
    poVar2 = std::operator<<((ostream *)local_188,"source: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 700));
    std::operator<<(poVar2,", ");
    poVar2 = std::operator<<((ostream *)local_188,"preset: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x2c0));
    std::operator<<(poVar2,"\n");
  }
  poVar2 = std::operator<<((ostream *)local_188,"METAR: ");
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    local_670 = (char *)std::__cxx11::string::c_str();
  }
  else {
    local_670 = "(nil)";
  }
  poVar2 = std::operator<<(poVar2,local_670);
  std::operator<<(poVar2,"\n");
  lVar1 = DataRefs::GetLogLevel(&dataRefs);
  if ((int)lVar1 < 1) {
    uVar4 = std::__cxx11::string::c_str();
    std::__cxx11::ostringstream::str();
    uVar5 = std::__cxx11::string::c_str();
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTWeather.cpp"
           ,0x17e,"Log",logDEBUG,"%s\n%s",uVar4,uVar5);
    std::__cxx11::string::~string(local_3e0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void LTWeather::Log (const std::string& msg) const
{
    std::ostringstream lOut;
    lOut << std::fixed << std::setprecision(1);
    lOut <<  "pos:         " << std::string(pos)         << "\n";
    lOut <<  "vis:         " << visibility_reported_sm   << "sm, ";
    lOut <<  "sea_pressure: "<< sealevel_pressure_pas    << "pas, ";
    lOut <<  "sea_temp: "    << sealevel_temperature_c   << "C, ";
    lOut <<  "qnh_base_elev: "<<qnh_base_elevation       << "?, ";
    lOut <<  "qnh_pas:"      << qnh_pas                  << ", ";
    lOut <<  "rain: "        << (rain_percent*100.0f)    << "%,\n";

#define LOG_WARR(label, var, unit)                          \
lOut << label;                                              \
for (const float& f: var) lOut << std::setw(8) << f << " "; \
lOut << unit "\n";
    
    LOG_WARR("wind_alt:    ",   wind_altitude_msl_m,        "m");
    LOG_WARR("wind_speed:  ",   wind_speed_msc,             "kts");
    LOG_WARR("wind_dir:    ",   wind_direction_degt,        "deg");
    LOG_WARR("shear_speed: ",   shear_speed_msc,            "kts");
    LOG_WARR("shear_dir:   ",   shear_direction_degt,       "deg");
    LOG_WARR("turbulence:  ",   turbulence,                 "");
    LOG_WARR("dewpoint:    ",   dewpoint_deg_c,             "C");
    LOG_WARR("temp_alt:    ",   temperature_altitude_msl_m, "m");
    LOG_WARR("temp:        ",   temperatures_aloft_deg_c,   "C");
    LOG_WARR("cloud_type:  ",   cloud_type,                 "0=Ci, 1=St, 2=Cu, 3=Cb");
    lOut <<  "cloud_cover: ";
    for (const float& f: cloud_coverage_percent) lOut << std::setw(8) << (f*100.0f) << " ";
    lOut <<  "%\n";
    LOG_WARR("cloud_base:  ",   cloud_base_msl_m,           "m");
    LOG_WARR("cloud_tops:  ",   cloud_tops_msl_m,           "m");
    lOut << std::setw(0);

    lOut <<  "tropo_temp:  " << tropo_temp_c             << "c, ";
    lOut <<  "tropo_alt: "   << tropo_alt_m              << "m, ";
    lOut <<  "thermal_rate: "<< thermal_rate_ms          << "m/s, ";
    lOut <<  "wave_amp: "    << wave_amplitude           << "m, ";
    lOut <<  "wave_dir: "    << wave_dir                 << "deg, ";
    lOut <<  "rwy_fric: "    << runway_friction          << ", ";
    lOut <<  "variability: " << (variability_pct*100.0f) << "%\n";
    
    // if any of the follow is filled (e.g. after getting weather from X-Plane for logging purposes)
    if (change_mode >= 0 || weather_source >= 0 || weather_preset >= 0) {
        lOut << "immediately: " << update_immediately << ", ";
        lOut << "change mode: " << change_mode << ", ";
        lOut << "source: " << weather_source << ", ";
        lOut << "preset: " << weather_preset << "\n";
    }
    
    lOut <<  "METAR: "       << (metar.empty() ? "(nil)" : metar.c_str()) << "\n";

    LOG_MSG(logDEBUG, "%s\n%s", msg.c_str(), lOut.str().c_str());
}